

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FSinglePicFont::FSinglePicFont(FSinglePicFont *this,char *picname)

{
  bool bVar1;
  int iVar2;
  FTexture *this_00;
  char *pcVar3;
  FTexture *pic;
  FTextureID local_1c;
  char *pcStack_18;
  FTextureID picnum;
  char *picname_local;
  FSinglePicFont *this_local;
  
  pcStack_18 = picname;
  FFont::FFont(&this->super_FFont,-1);
  (this->super_FFont)._vptr_FFont = (_func_int **)&PTR__FSinglePicFont_009fd300;
  FTextureID::FTextureID(&this->PicNum);
  local_1c = FTextureManager::CheckForTexture(&TexMan,pcStack_18,0,1);
  bVar1 = FTextureID::isValid(&local_1c);
  if (!bVar1) {
    I_FatalError("%s is not a font or texture",pcStack_18);
  }
  this_00 = FTextureManager::operator[](&TexMan,local_1c);
  pcVar3 = copystring(pcStack_18);
  (this->super_FFont).Name = pcVar3;
  iVar2 = FTexture::GetScaledHeight(this_00);
  (this->super_FFont).FontHeight = iVar2;
  iVar2 = FTexture::GetScaledWidth(this_00);
  (this->super_FFont).SpaceWidth = iVar2;
  (this->super_FFont).GlobalKerning = 0;
  (this->super_FFont).LastChar = 0x41;
  (this->super_FFont).FirstChar = 0x41;
  (this->super_FFont).ActiveColors = 0;
  (this->PicNum).texnum = local_1c.texnum;
  (this->super_FFont).Next = FFont::FirstFont;
  FFont::FirstFont = &this->super_FFont;
  return;
}

Assistant:

FSinglePicFont::FSinglePicFont(const char *picname) :
	FFont(-1) // Since lump is only needed for priority information we don't need to worry about this here.
{
	FTextureID picnum = TexMan.CheckForTexture (picname, FTexture::TEX_Any);

	if (!picnum.isValid())
	{
		I_FatalError ("%s is not a font or texture", picname);
	}

	FTexture *pic = TexMan[picnum];

	Name = copystring(picname);
	FontHeight = pic->GetScaledHeight();
	SpaceWidth = pic->GetScaledWidth();
	GlobalKerning = 0;
	FirstChar = LastChar = 'A';
	ActiveColors = 0;
	PicNum = picnum;

	Next = FirstFont;
	FirstFont = this;
}